

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchMan.c
# Opt level: O0

void Dch_ManStop(Dch_Man_t *p)

{
  Dch_Man_t *p_local;
  
  Aig_ManFanoutStop(p->pAigTotal);
  if (p->pPars->fVerbose != 0) {
    Dch_ManPrintStats(p);
  }
  if (p->pAigFraig != (Aig_Man_t *)0x0) {
    Aig_ManStop(p->pAigFraig);
  }
  if (p->ppClasses != (Dch_Cla_t *)0x0) {
    Dch_ClassesStop(p->ppClasses);
  }
  if (p->pSat != (sat_solver *)0x0) {
    sat_solver_delete(p->pSat);
  }
  Vec_PtrFree(p->vUsedNodes);
  Vec_PtrFree(p->vFanins);
  Vec_PtrFree(p->vSimRoots);
  Vec_PtrFree(p->vSimClasses);
  if (p->pReprsProved != (Aig_Obj_t **)0x0) {
    free(p->pReprsProved);
    p->pReprsProved = (Aig_Obj_t **)0x0;
  }
  if (p->pSatVars != (int *)0x0) {
    free(p->pSatVars);
    p->pSatVars = (int *)0x0;
  }
  if (p != (Dch_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Dch_ManStop( Dch_Man_t * p )
{
    Aig_ManFanoutStop( p->pAigTotal );
    if ( p->pPars->fVerbose )
        Dch_ManPrintStats( p );
    if ( p->pAigFraig )
        Aig_ManStop( p->pAigFraig );
    if ( p->ppClasses )
        Dch_ClassesStop( p->ppClasses );
    if ( p->pSat )
        sat_solver_delete( p->pSat );
    Vec_PtrFree( p->vUsedNodes );
    Vec_PtrFree( p->vFanins );
    Vec_PtrFree( p->vSimRoots );
    Vec_PtrFree( p->vSimClasses );
    ABC_FREE( p->pReprsProved );
    ABC_FREE( p->pSatVars );
    ABC_FREE( p );
}